

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O1

void Dch_ClassesPrintOne(Dch_Cla_t *p,Aig_Obj_t *pRepr)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pObj;
  uint uVar3;
  long lVar4;
  int level;
  long lVar5;
  Aig_Man_t *p_00;
  
  p_00 = (Aig_Man_t *)p;
  Abc_Print((int)p,"{ ");
  level = (int)p_00;
  lVar4 = (long)pRepr->Id;
  if (0 < p->pClassSizes[lVar4]) {
    lVar5 = 0;
    do {
      pObj = p->pId2Class[lVar4][lVar5];
      if (pObj != (Aig_Obj_t *)0x0) {
        uVar1 = pObj->Id;
        uVar2 = *(uint *)&pObj->field_0x1c;
        p_00 = p->pAig;
        uVar3 = Aig_SupportSize(p_00,pObj);
        Abc_Print((int)p_00,"%d(%d,%d) ",(ulong)uVar1,(ulong)(uVar2 & 0xffffff),(ulong)uVar3);
      }
      level = (int)p_00;
      lVar5 = lVar5 + 1;
      lVar4 = (long)pRepr->Id;
    } while (lVar5 < p->pClassSizes[lVar4]);
  }
  Abc_Print(level,"}\n");
  return;
}

Assistant:

void Dch_ClassesPrintOne( Dch_Cla_t * p, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "{ " );
    Dch_ClassForEachNode( p, pRepr, pObj, i )
        Abc_Print( 1, "%d(%d,%d) ", pObj->Id, pObj->Level, Aig_SupportSize(p->pAig,pObj) );
    Abc_Print( 1, "}\n" );
}